

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::insert
          (array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
           *this,CString *item,range r)

{
  long lVar1;
  bool bVar2;
  CString *pCVar3;
  CString *in_RDI;
  long in_FS_OFFSET;
  int i;
  int index;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_38;
  int local_1c;
  plain_range<CLocalizationDatabase::CString> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = plain_range<CLocalizationDatabase::CString>::empty(&local_18);
  if (bVar2) {
    local_1c = add((array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
                    *)in_RDI,
                   (CString *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    pCVar3 = plain_range<CLocalizationDatabase::CString>::front
                       ((plain_range<CLocalizationDatabase::CString> *)in_RDI);
    lVar1 = *(long *)in_RDI;
    incsize((array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
             *)in_RDI);
    size((array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
          *)in_RDI);
    set_size((array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
              *)in_RDI,in_stack_ffffffffffffffbc);
    local_38 = *(int *)((long)&(in_RDI->m_Replacement).str + 4);
    while (local_38 = local_38 + -1, (int)(((long)pCVar3 - lVar1) / 0x18) < local_38) {
      CLocalizationDatabase::CString::operator=
                (in_RDI,(CString *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    CLocalizationDatabase::CString::operator=
              (in_RDI,(CString *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_1c = *(int *)((long)&(in_RDI->m_Replacement).str + 4) + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}